

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

iterator * __thiscall
tcb::unicode::detail::
unicode_view<std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>,_std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>,_char16_t,_char32_t>
::iterator::operator++(iterator *this)

{
  byte bVar1;
  int_type iVar2;
  int_type iVar3;
  code_point cVar4;
  undefined8 in_RCX;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last;
  
  bVar1 = this->idx_ + 1;
  this->idx_ = bVar1;
  if ((this->next_chars_).size_ == (uint)bVar1) {
    iVar2 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&this->first_);
    iVar3 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&this->last_);
    if ((iVar2 == 0xffff) != (iVar3 == 0xffff)) {
      last._M_sbuf = (streambuf_type *)(ulong)*(uint *)&(this->last_)._M_c;
      last._8_8_ = in_RCX;
      cVar4 = utf_traits<char16_t,2>::
              decode<std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>,std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>>
                        ((utf_traits<char16_t,2> *)&this->first_,
                         (istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)
                         (this->last_)._M_sbuf,last);
      this->next_chars_ = (encoded_chars<char32_t>)((ulong)(uint)cVar4 | 0x100000000);
      this->idx_ = '\0';
    }
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }